

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BeginTransaction(Parse *pParse,int type)

{
  int iVar1;
  Vdbe *p;
  int in_ESI;
  char *in_RDI;
  int i;
  Vdbe *v;
  sqlite3 *db;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  Parse *in_stack_ffffffffffffffe0;
  char *zArg3;
  undefined4 in_stack_fffffffffffffff0;
  
  zArg3 = *(char **)in_RDI;
  iVar1 = sqlite3AuthCheck((Parse *)v,i,in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                           zArg3);
  if ((iVar1 == 0) && (p = sqlite3GetVdbe(in_stack_ffffffffffffffe0), p != (Vdbe *)0x0)) {
    if (in_ESI != 7) {
      for (in_stack_ffffffffffffffdc = 0; in_stack_ffffffffffffffdc < *(int *)(zArg3 + 0x28);
          in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
        sqlite3VdbeAddOp2(p,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
        sqlite3VdbeUsesBtree(p,in_stack_ffffffffffffffdc);
      }
    }
    sqlite3VdbeAddOp2(p,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTransaction(Parse *pParse, int type){
  sqlite3 *db;
  Vdbe *v;
  int i;

  assert( pParse!=0 );
  db = pParse->db;
  assert( db!=0 );
/*  if( db->aDb[0].pBt==0 ) return; */
  if( sqlite3AuthCheck(pParse, SQLITE_TRANSACTION, "BEGIN", 0, 0) ){
    return;
  }
  v = sqlite3GetVdbe(pParse);
  if( !v ) return;
  if( type!=TK_DEFERRED ){
    for(i=0; i<db->nDb; i++){
      sqlite3VdbeAddOp2(v, OP_Transaction, i, (type==TK_EXCLUSIVE)+1);
      sqlite3VdbeUsesBtree(v, i);
    }
  }
  sqlite3VdbeAddOp2(v, OP_AutoCommit, 0, 0);
}